

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O0

ssize_t __thiscall Vault::KeyValue::read(KeyValue *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  string local_88;
  string local_68;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  Tiny<Vault::SecretVersionDetail,_long> *local_28;
  SecretVersion *secretVersion_local;
  Path *path_local;
  KeyValue *this_local;
  
  path_local = (Path *)CONCAT44(in_register_00000034,__fd);
  local_28 = (Tiny<Vault::SecretVersionDetail,_long> *)__nbytes;
  secretVersion_local = (SecretVersion *)__buf;
  this_local = this;
  Vault::operator+(&local_88,
                   (Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)__buf,"?version=");
  Vault::operator+(&local_68,&local_88,local_28);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_48,&local_68);
  read(this,__fd,&local_48,__nbytes);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return (ssize_t)this;
}

Assistant:

std::optional<std::string>
Vault::KeyValue::read(const Vault::Path &path,
                      const Vault::SecretVersion &secretVersion) {
  return read(Vault::Path{path + "?version=" + secretVersion});
}